

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_conductor.hpp
# Opt level: O1

Color __thiscall
RoughConductorBRDF::sample_f
          (RoughConductorBRDF *this,Color *albedo,vec3f *wo,vec3f *wi,float *pdf,Sampler *sampler)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  undefined8 extraout_XMM0_Qa;
  float fVar6;
  undefined8 uVar5;
  undefined8 extraout_XMM0_Qa_00;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar17;
  vec3f vVar18;
  Color CVar19;
  
  (*sampler->_vptr_Sampler[1])();
  vVar18 = schuttejoe::GgxVndf((schuttejoe *)sampler,*wo,this->alpha,(float)extraout_XMM0_Qa,
                               (float)((ulong)extraout_XMM0_Qa >> 0x20));
  fVar7 = vVar18.z;
  fVar3 = vVar18.x;
  fVar6 = vVar18.y;
  uVar1 = wo->x;
  uVar2 = wo->y;
  fVar12 = fVar7 * wo->z + fVar3 * (float)uVar1 + fVar6 * (float)uVar2;
  fVar12 = fVar12 + fVar12;
  fVar13 = fVar12 * fVar3 - (float)uVar1;
  fVar16 = fVar12 * fVar6 - (float)uVar2;
  fVar10 = fVar7 * fVar12 - wo->z;
  wi->x = fVar13;
  wi->y = fVar16;
  wi->z = fVar10;
  fVar12 = -fVar7;
  fVar9 = fVar3;
  fVar11 = fVar6;
  if (fVar7 < fVar12) {
    fVar9 = -fVar3;
    fVar11 = -fVar6;
  }
  fVar17 = this->alpha;
  fVar8 = 1.0 - fVar10 * fVar10;
  fVar4 = 0.0;
  if (0.0 < fVar8) {
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
    }
    else {
      fVar8 = SQRT(fVar8);
    }
    fVar4 = fVar8 / fVar10;
  }
  fVar8 = 1.0;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    if (fVar12 <= fVar7) {
      fVar12 = fVar7;
    }
    fVar8 = 0.0;
    if (0.0 < (fVar12 * fVar10 + fVar13 * fVar9 + fVar16 * fVar11) * fVar10) {
      fVar17 = fVar17 * ABS(fVar4);
      fVar12 = fVar17 * fVar17 + 1.0;
      if (fVar12 < 0.0) {
        fVar12 = sqrtf(fVar12);
      }
      else {
        fVar12 = SQRT(fVar12);
      }
      fVar8 = 2.0 / (fVar12 + 1.0);
    }
  }
  fVar12 = this->alpha;
  fVar11 = fVar7 * fVar7;
  fVar9 = 0.0;
  auVar14._4_4_ = fVar12;
  auVar14._0_4_ = 0x3f800000;
  auVar14._8_8_ = 0;
  auVar15._4_4_ =
       (fVar12 * fVar12 + (float)(-(uint)(0.0 < 1.0 - fVar11) & (uint)((1.0 - fVar11) / fVar11))) *
       fVar11;
  auVar15._0_4_ = PI;
  auVar15._8_8_ = 0;
  auVar15 = divps(auVar14,auVar15);
  *pdf = (ABS(fVar7 * wo->z + wo->x * fVar3 + wo->y * fVar6) *
         auVar15._4_4_ * auVar15._4_4_ * auVar15._0_4_ * fVar8) /
         (ABS(wo->z) * ABS(wi->z * fVar7 + fVar3 * wi->x + fVar6 * wi->y) * 4.0);
  uVar5 = 0;
  if (wi->z < 0.0 == wo->z < 0.0) {
    fVar9 = 0.0;
    (*(this->super_BRDF)._vptr_BRDF[1])(this,albedo,wo,wi);
    uVar5 = extraout_XMM0_Qa_00;
  }
  CVar19.z = fVar9;
  CVar19.x = (float)(int)uVar5;
  CVar19.y = (float)(int)((ulong)uVar5 >> 0x20);
  return CVar19;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		vec2f u = sampler.get2f();
    	vec3f wm = schuttejoe::GgxVndf(wo, alpha, u.x, u.y);
		wi = 2*dot(wm,wo)*wm-wo;
		// http://jcgt.org/published/0007/04/01/paper.pdf Eric Heitz
		pdf = EDX::Smith_G1(wi, wm, alpha) * EDX::GGX_D(wm,alpha) * fabs(dot(wo,wm)) / (4 * fabs(dot(wi, wm)) * fabs(wo.z));
    	if (wi.z<0 ^ wo.z<0) return 0;
    	return f(albedo, wo, wi);
	}